

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listimagewindow.cc
# Opt level: O0

void __thiscall
bgui::ListImageWindow::onKey(ListImageWindow *this,char c,SpecialKey key,int x,int y)

{
  int iVar1;
  size_type sVar2;
  int in_ECX;
  int in_EDX;
  undefined1 in_SIL;
  long in_RDI;
  int in_R8D;
  bool in_stack_0000001e;
  undefined1 in_stack_0000001f;
  undefined3 in_stack_0000002c;
  ListImageWindow *in_stack_00000210;
  int in_stack_00000260;
  int in_stack_00000264;
  SpecialKey in_stack_00000268;
  char in_stack_0000026f;
  ImageWindow *in_stack_00000270;
  bool in_stack_ffffffffffffffe3;
  int iVar3;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar4;
  
  uVar4 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  if (in_EDX == 2) {
    if (0 < *(int *)(in_RDI + 0x88)) {
      *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + -1;
      set((ListImageWindow *)CONCAT44(uVar4,2),in_ECX,in_R8D,2,in_stack_ffffffffffffffe3);
    }
    BaseWindow::setInfoLine
              ((BaseWindow *)CONCAT44(_in_stack_0000002c,key),(char *)CONCAT44(x,y),
               (bool)in_stack_0000001f,in_stack_0000001e);
  }
  else if (in_EDX == 3) {
    *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
    iVar1 = *(int *)(in_RDI + 0x88);
    iVar3 = in_EDX;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x58));
    if (iVar1 < (int)sVar2) {
      set((ListImageWindow *)CONCAT44(uVar4,iVar3),in_ECX,in_R8D,in_EDX,in_stack_ffffffffffffffe3);
    }
    else {
      *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + -1;
    }
    BaseWindow::setInfoLine
              ((BaseWindow *)CONCAT44(_in_stack_0000002c,key),(char *)CONCAT44(x,y),
               (bool)in_stack_0000001f,in_stack_0000001e);
  }
  if ((char)((uint)uVar4 >> 0x18) == 'k') {
    iVar1 = *(int *)(in_RDI + 0xb0);
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0xb0) = 1;
    }
    else if (iVar1 == 1) {
      *(undefined4 *)(in_RDI + 0xb0) = 2;
    }
    else if (iVar1 == 2) {
      *(undefined4 *)(in_RDI + 0xb0) = 0;
    }
    updateTitle(in_stack_00000210);
  }
  ImageWindow::onKey(in_stack_00000270,in_stack_0000026f,in_stack_00000268,in_stack_00000264,
                     in_stack_00000260);
  return;
}

Assistant:

void ListImageWindow::onKey(char c, SpecialKey key, int x, int y)
{
  switch (key)
  {
    case k_left: /* load previous image */
      if (current > 0)
      {
        current--;
        set(current);
      }

      setInfoLine("");
      break;

    case k_right: /* load next image */
      current++;

      if (current < static_cast<int>(name.size()))
      {
        set(current);
      }
      else
      {
        current--;
      }

      setInfoLine("");
      break;

    default:
      break;
  }

  switch (c)
  {
    case 'k':
      switch (kp)
      {
        case keep_none:
          kp=keep_most;
          break;

        case keep_most:
          kp=keep_all;
          break;

        case keep_all:
          kp=keep_none;
          break;
      }

      updateTitle();
      break;
  }

  ImageWindow::onKey(c, key, x, y);
}